

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

lest * __thiscall
lest::to_string<char,int,double,char_const*>
          (lest *this,tuple<char,_int,_double,_const_char_*> *tuple)

{
  make_tuple_string<std::tuple<char,int,double,char_const*>,4ul> local_78 [32];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  tuple<char,_int,_double,_const_char_*> *local_18;
  tuple<char,_int,_double,_const_char_*> *tuple_local;
  
  local_18 = tuple;
  tuple_local = (tuple<char,_int,_double,_const_char_*> *)this;
  make_tuple_string<std::tuple<char,int,double,char_const*>,4ul>::make_abi_cxx11_(local_78,tuple);
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"{ ");
  std::operator+(local_38,(char *)local_58);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)local_78);
  return this;
}

Assistant:

auto to_string( std::tuple<TS...> const & tuple ) -> std::string
{
    return "{ " + make_tuple_string<std::tuple<TS...>, sizeof...(TS)>::make( tuple ) + "}";
}